

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateMaxBroadcastableLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,2,2);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateMaxBroadcastableLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    return Result();
}